

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

bool kratos::MultipleDriverVisitor::share_root(IRNode *node1,IRNode *node2)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar3;
  undefined1 local_d0 [8];
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> diff;
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> nodes1;
  set<kratos::IRNode_*,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_> nodes2;
  IRNode *node1_local;
  IRNode *node2_local;
  
  nodes1._M_t._M_impl._0_4_ = 0;
  nodes1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nodes1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  nodes2._M_t._M_impl._0_4_ = 0;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  nodes1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nodes1;
  nodes1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&nodes1;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nodes2;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&nodes2;
  nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)node1;
  node1_local = node2;
  while( true ) {
    lVar2 = (**(code **)(*(long *)nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20))
                      (nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (lVar2 == 0) break;
    lVar2 = (**(code **)(*(long *)nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20))()
    ;
    if (*(int *)(lVar2 + 0x48) != 2) break;
    std::
    _Rb_tree<kratos::IRNode*,kratos::IRNode*,std::_Identity<kratos::IRNode*>,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
    ::_M_emplace_unique<kratos::IRNode*&>
              ((_Rb_tree<kratos::IRNode*,kratos::IRNode*,std::_Identity<kratos::IRNode*>,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                *)&diff._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IRNode **)&nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (**(code **)(*(long *)nodes2._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20))();
  }
  do {
    iVar1 = (*node2->_vptr_IRNode[4])(node2);
    if (CONCAT44(extraout_var_01,iVar1) == 0) {
LAB_0021f920:
      diff._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&diff;
      diff._M_t._M_impl._0_4_ = 0;
      diff._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      diff._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      diff._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      diff._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           diff._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::
      __set_intersection<std::_Rb_tree_const_iterator<kratos::IRNode*>,std::_Rb_tree_const_iterator<kratos::IRNode*>,std::insert_iterator<std::set<kratos::IRNode*,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (nodes1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Base_ptr)&nodes1,
                 nodes2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Base_ptr)&nodes2,
                 local_d0);
      bVar3 = diff._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0;
      std::
      _Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
      ::~_Rb_tree((_Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                   *)local_d0);
      std::
      _Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
      ::~_Rb_tree((_Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                   *)&nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
      ::~_Rb_tree((_Rb_tree<kratos::IRNode_*,_kratos::IRNode_*,_std::_Identity<kratos::IRNode_*>,_std::less<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
                   *)&diff._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return bVar3;
    }
    iVar1 = (*node1_local->_vptr_IRNode[4])();
    if (*(int *)(CONCAT44(extraout_var,iVar1) + 0x48) != 2) goto LAB_0021f920;
    std::
    _Rb_tree<kratos::IRNode*,kratos::IRNode*,std::_Identity<kratos::IRNode*>,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
    ::_M_emplace_unique<kratos::IRNode*&>
              ((_Rb_tree<kratos::IRNode*,kratos::IRNode*,std::_Identity<kratos::IRNode*>,std::less<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                *)&nodes1._M_t._M_impl.super__Rb_tree_header._M_node_count,&node1_local);
    iVar1 = (*node1_local->_vptr_IRNode[4])();
    node2 = (IRNode *)CONCAT44(extraout_var_00,iVar1);
    node1_local = node2;
  } while( true );
}

Assistant:

static bool share_root(IRNode* node1, IRNode* node2) {
        std::set<IRNode*> nodes1;
        std::set<IRNode*> nodes2;
        while (node1->parent() && node1->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            nodes1.emplace(node1);
            node1 = node1->parent();
        }
        while (node2->parent() && node2->parent()->ir_node_kind() == IRNodeKind::StmtKind) {
            nodes2.emplace(node2);
            node2 = node2->parent();
        }
        std::set<IRNode*> diff;
        std::set_intersection(nodes1.begin(), nodes1.end(), nodes2.begin(), nodes2.end(),
                              std::inserter(diff, diff.begin()));
        return !diff.empty();
    }